

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::generateShaders
          (SSBOBindingRenderCase *this)

{
  TestType TVar1;
  uint uVar2;
  ShaderType SVar3;
  RenderContext *renderCtx;
  SSBOBindingRenderCase *pSVar4;
  ulong uVar5;
  ostream *poVar6;
  ShaderProgram *this_00;
  ProgramSources *pPVar7;
  uint uVar8;
  char *pcVar9;
  string *this_01;
  int declNdx;
  ulong uVar10;
  allocator<char> local_562;
  allocator<char> local_561;
  SSBOBindingRenderCase *local_560;
  undefined1 local_558 [40];
  ulong local_530;
  string *local_528;
  ulong local_520;
  undefined1 local_518 [40];
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string uname;
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  TVar1 = (this->super_LayoutBindingRenderCase).m_testType;
  local_530 = (ulong)TVar1;
  uVar2 = (this->super_LayoutBindingRenderCase).m_numBindings;
  uVar8 = TVar1 - TESTTYPE_BINDING_ARRAY;
  uVar10 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar10;
  }
  local_528 = &(this->super_LayoutBindingRenderCase).m_uniformName;
  local_520 = 1;
  if (1 < uVar8) {
    local_520 = uVar5;
  }
  local_560 = this;
  for (; local_520 != uVar10; uVar10 = uVar10 + 1) {
    poVar6 = std::operator<<((ostream *)&shaderUniformDecl,"layout(std140, binding = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(local_560->super_LayoutBindingRenderCase).m_bindings.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
    poVar6 = std::operator<<(poVar6,") buffer ");
    declNdx = (int)uVar10;
    getUniformName(&uname,local_528,declNdx);
    poVar6 = std::operator<<(poVar6,(string *)&uname);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"{\n");
    poVar6 = std::operator<<(poVar6,"\thighp vec4 color1;\n");
    poVar6 = std::operator<<(poVar6,"\thighp vec4 color2;\n");
    poVar6 = std::operator<<(poVar6,"} ");
    if (uVar8 < 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"colors",&local_561);
      getUniformName((string *)local_518,&local_410,declNdx,
                     (local_560->super_LayoutBindingRenderCase).m_numBindings);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"colors",&local_562);
      getUniformName((string *)local_518,&local_430,declNdx);
    }
    poVar6 = std::operator<<(poVar6,(string *)local_518);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)local_518);
    if (uVar8 < 2) {
      this_01 = &local_410;
    }
    else {
      this_01 = &local_430;
    }
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::~string((string *)&uname);
  }
  for (local_558._0_4_ = SHADERTYPE_VERTEX;
      (int)local_558._0_4_ < (local_560->super_LayoutBindingRenderCase).m_numBindings * 2;
      local_558._0_4_ = local_558._0_4_ + SHADERTYPE_FRAGMENT) {
    if (uVar8 < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_518,"colors",(allocator<char> *)&local_4f0);
      getUniformName(&uname,(string *)local_518,0,(int)local_558._0_4_ / 2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_518,"colors",(allocator<char> *)&local_4f0);
      getUniformName(&uname,(string *)local_518,(int)local_558._0_4_ / 2);
    }
    std::__cxx11::string::~string((string *)local_518);
    poVar6 = std::operator<<((ostream *)&shaderBody,"\t");
    pcVar9 = "else if";
    if (local_558._0_4_ == SHADERTYPE_VERTEX) {
      pcVar9 = "if";
    }
    poVar6 = std::operator<<(poVar6,pcVar9);
    poVar6 = std::operator<<(poVar6," (u_arrayNdx == ");
    de::toString<int>((string *)local_518,(int *)local_558);
    poVar6 = std::operator<<(poVar6,(string *)local_518);
    poVar6 = std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<(poVar6,"\t{\n");
    poVar6 = std::operator<<(poVar6,"\t\tcolor = ");
    poVar6 = std::operator<<(poVar6,(string *)&uname);
    pcVar9 = ".color2";
    if ((local_558._0_4_ & SHADERTYPE_FRAGMENT) == SHADERTYPE_VERTEX) {
      pcVar9 = ".color1";
    }
    poVar6 = std::operator<<(poVar6,pcVar9);
    poVar6 = std::operator<<(poVar6,";\n");
    std::operator<<(poVar6,"\t}\n");
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&uname);
  }
  poVar6 = std::operator<<((ostream *)&shaderBody,"\telse\n");
  poVar6 = std::operator<<(poVar6,"\t{\n");
  poVar6 = std::operator<<(poVar6,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar6,"\t}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pSVar4 = local_560;
  renderCtx = ((local_560->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  memset(&uname,0,0xac);
  SVar3 = (pSVar4->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_4f0,SVar3,&local_450,&local_470);
  glu::VertexSource::VertexSource((VertexSource *)local_518,&local_4f0);
  pPVar7 = glu::ProgramSources::operator<<((ProgramSources *)&uname,(ShaderSource *)local_518);
  SVar3 = (pSVar4->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_490,SVar3,&local_4b0,&local_4d0);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_558,&local_490);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_558);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar7);
  std::__cxx11::string::~string((string *)(local_558 + 8));
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)(local_518 + 8));
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&uname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderUniformDecl);
  return this_00;
}

Assistant:

glu::ShaderProgram* SSBOBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(std140, binding = " << m_bindings[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}